

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_gc.c
# Opt level: O0

void lj_gc_finalize_cdata(lua_State *L)

{
  cTValue local_78;
  TValue tmp;
  GCobj *o;
  ptrdiff_t i;
  Node *node;
  GCtab *t;
  CTState *cts;
  global_State *g;
  lua_State *L_local;
  cTValue *local_30;
  global_State *local_28;
  char *local_20;
  cTValue *local_18;
  global_State *local_10;
  
  cts = (CTState *)(L->glref).ptr64;
  t = *(GCtab **)(cts->hash + 0x3c);
  if (t != (GCtab *)0x0) {
    node = (Node *)(t->metatable).gcptr64;
    i = node[1].next.ptr64;
    node[1].key.u64 = 0;
    g = (global_State *)L;
    for (o = (GCobj *)(ulong)node[2].val.field_4.it; -1 < (long)o; o = (GCobj *)((long)o + -1)) {
      if ((*(long *)(i + (long)o * 0x18) != -1) &&
         ((int)((long)*(undefined8 *)(i + (long)o * 0x18 + 8) >> 0x2f) == -0xb)) {
        tmp.u64 = *(ulong *)(i + (long)o * 0x18 + 8) & 0x7fffffffffff;
        *(byte *)(tmp.u64 + 8) = *(uint8_t *)(tmp.u64 + 8) & 0xf8 | *(byte *)&cts->finalizer & 3;
        *(byte *)(tmp.u64 + 8) = *(uint8_t *)(tmp.u64 + 8) & 0xef;
        L_local = (lua_State *)(i + (long)o * 0x18);
        local_28 = g;
        local_30 = &local_78;
        local_78.gcr.gcptr64 = (GCRef)(L_local->nextgc).gcptr64;
        local_10 = g;
        local_20 = "copy of dead GC object";
        *(undefined8 *)(i + (long)o * 0x18) = 0xffffffffffffffff;
        local_18 = local_30;
        gc_call_finalizer((global_State *)cts,(lua_State *)g,&local_78,(GCobj *)tmp);
      }
    }
  }
  return;
}

Assistant:

void lj_gc_finalize_cdata(lua_State *L)
{
  global_State *g = G(L);
  CTState *cts = ctype_ctsG(g);
  if (cts) {
    GCtab *t = cts->finalizer;
    Node *node = noderef(t->node);
    ptrdiff_t i;
    setgcrefnull(t->metatable);  /* Mark finalizer table as disabled. */
    for (i = (ptrdiff_t)t->hmask; i >= 0; i--)
      if (!tvisnil(&node[i].val) && tviscdata(&node[i].key)) {
	GCobj *o = gcV(&node[i].key);
	TValue tmp;
	makewhite(g, o);
	o->gch.marked &= (uint8_t)~LJ_GC_CDATA_FIN;
	copyTV(L, &tmp, &node[i].val);
	setnilV(&node[i].val);
	gc_call_finalizer(g, L, &tmp, o);
      }
  }
}